

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

real fasttext::utils::sigmoid(real x)

{
  int i;
  real x_local;
  undefined4 local_4;
  
  if (-8.0 <= x) {
    if (x <= 8.0) {
      local_4 = *(real *)(t_sigmoid + (long)(int)((((x + 8.0) * 512.0) / 8.0) / 2.0) * 4);
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

real sigmoid(real x) {
    if (x < -MAX_SIGMOID) {
      return 0.0;
    } else if (x > MAX_SIGMOID) {
      return 1.0;
    } else {
      int i = int((x + MAX_SIGMOID) * SIGMOID_TABLE_SIZE / MAX_SIGMOID / 2);
      return t_sigmoid[i];
    }
  }